

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

bool BinaryenMemoryIs64(BinaryenModuleRef module,char *name)

{
  char *this;
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer this_01;
  Fatal *pFVar3;
  Fatal local_1b8;
  string_view local_30;
  Memory *local_20;
  Memory *memory;
  char *name_local;
  BinaryenModuleRef module_local;
  
  memory = (Memory *)name;
  name_local = (char *)module;
  if (name == (char *)0x0) {
    sVar2 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&module->memories);
    if (sVar2 == 1) {
      this_00 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(name_local + 0x78),0);
      this_01 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (this_00);
      memory = (Memory *)
               std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)this_01);
    }
  }
  this = name_local;
  wasm::Name::Name((Name *)&local_30,(char *)memory);
  local_20 = wasm::Module::getMemoryOrNull((Module *)this,(Name)local_30);
  if (local_20 == (Memory *)0x0) {
    wasm::Fatal::Fatal(&local_1b8);
    pFVar3 = wasm::Fatal::operator<<(&local_1b8,(char (*) [17])"invalid memory \'");
    pFVar3 = wasm::Fatal::operator<<(pFVar3,(char **)&memory);
    wasm::Fatal::operator<<(pFVar3,(char (*) [3])"\'.");
    wasm::Fatal::~Fatal(&local_1b8);
  }
  bVar1 = wasm::Memory::is64(local_20);
  return bVar1;
}

Assistant:

bool BinaryenMemoryIs64(BinaryenModuleRef module, const char* name) {
  // Maintaining compatibility for instructions with a single memory
  if (name == nullptr && module->memories.size() == 1) {
    name = module->memories[0]->name.str.data();
  }
  auto* memory = ((Module*)module)->getMemoryOrNull(name);
  if (memory == nullptr) {
    Fatal() << "invalid memory '" << name << "'.";
  }
  return memory->is64();
}